

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

Matrix<double,_3,_4> * __thiscall
gl4cts::Math::outerProduct<4,3>
          (Matrix<double,_3,_4> *__return_storage_ptr__,Math *this,Vector<double,_3> *left,
          Vector<double,_4> *right)

{
  int row_1;
  long lVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  undefined1 *puVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  bool bVar8;
  double dVar9;
  Matrix<double,_3,_1> local_b8;
  Matrix<double,_1,_4> local_98;
  undefined1 local_78 [96];
  
  lVar1 = 0;
  auVar6 = _DAT_019f34d0;
  do {
    bVar8 = SUB164(auVar6 ^ _DAT_019ec5b0,4) == -0x80000000 &&
            SUB164(auVar6 ^ _DAT_019ec5b0,0) < -0x7ffffffd;
    if (bVar8) {
      dVar9 = 1.0;
      if (lVar1 != 0) {
        dVar9 = 0.0;
      }
      local_b8.m_data.m_data[0].m_data[lVar1] = dVar9;
    }
    if (bVar8) {
      local_b8.m_data.m_data[0].m_data[lVar1 + 1] = 0.0;
    }
    lVar1 = lVar1 + 2;
    lVar3 = auVar6._8_8_;
    auVar6._0_8_ = auVar6._0_8_ + 2;
    auVar6._8_8_ = lVar3 + 2;
  } while (lVar1 != 4);
  (__return_storage_ptr__->m_data).m_data[3].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[3].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[3].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  lVar1 = 0;
  lVar3 = 0;
  pdVar2 = (double *)__return_storage_ptr__;
  do {
    lVar4 = 0;
    do {
      uVar7 = 0x3ff0000000000000;
      if (lVar1 != lVar4) {
        uVar7 = 0;
      }
      *(undefined8 *)((long)pdVar2 + lVar4) = uVar7;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x60);
    lVar3 = lVar3 + 1;
    pdVar2 = pdVar2 + 1;
    lVar1 = lVar1 + 0x18;
  } while (lVar3 != 3);
  local_b8.m_data.m_data[0].m_data[2] = *(double *)(this + 0x10);
  local_b8.m_data.m_data[0].m_data[0] = *(double *)this;
  local_b8.m_data.m_data[0].m_data[1] = *(double *)(this + 8);
  local_98.m_data.m_data[0].m_data[0] = (double  [1])left->m_data[0];
  local_98.m_data.m_data[1].m_data[0] = (double  [1])left->m_data[1];
  local_98.m_data.m_data[2].m_data[0] = (double  [1])left->m_data[2];
  local_98.m_data.m_data[3].m_data[0] = (double  [1])left[1].m_data[0];
  puVar5 = local_78;
  tcu::operator*(&local_b8,&local_98);
  lVar1 = 0;
  pdVar2 = (double *)__return_storage_ptr__;
  do {
    lVar3 = 0;
    do {
      *(undefined8 *)((long)pdVar2 + lVar3) = *(undefined8 *)(puVar5 + lVar3);
      lVar3 = lVar3 + 0x18;
    } while (lVar3 != 0x60);
    lVar1 = lVar1 + 1;
    pdVar2 = pdVar2 + 1;
    puVar5 = puVar5 + 8;
  } while (lVar1 != 3);
  return __return_storage_ptr__;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Rows, Cols> outerProduct(const tcu::Vector<glw::GLdouble, Rows>& left,
														   const tcu::Vector<glw::GLdouble, Cols>& right)
{
	tcu::Matrix<glw::GLdouble, Rows, 1>	left_mat;
	tcu::Matrix<glw::GLdouble, 1, Cols>	right_mat;
	tcu::Matrix<glw::GLdouble, Rows, Cols> result;

	for (glw::GLuint i = 0; i < Rows; ++i)
	{
		left_mat(i, 0) = left[i];
	}

	for (glw::GLuint i = 0; i < Cols; ++i)
	{
		right_mat(0, i) = right[i];
	}

	result = left_mat * right_mat;

	return result;
}